

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

void ma_device__read_frames_from_client(ma_device *pDevice,ma_uint32 frameCount,void *pFramesOut)

{
  ulong outputFrameCount;
  ma_result mVar1;
  ulong uVar2;
  void *pRunningFramesOut;
  ulong uVar3;
  ulong uVar4;
  ma_uint64 totalFramesReadOut;
  ma_uint64 framesReadThisIterationOut;
  ma_uint64 framesReadThisIterationIn;
  ma_uint8 pIntermediaryBuffer [4096];
  ulong local_1060;
  ulong local_1058;
  ulong local_1050;
  ma_resampler *local_1048;
  ma_data_converter *local_1040;
  undefined1 local_1038 [4104];
  
  if (frameCount == 0) {
    __assert_fail("frameCount > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x22ef,"void ma_device__read_frames_from_client(ma_device *, ma_uint32, void *)")
    ;
  }
  if (pFramesOut != (void *)0x0) {
    outputFrameCount = (ulong)frameCount;
    if (((pDevice->playback).converter.field_0x2768 & 0x10) != 0) {
      ma_device__on_data(pDevice,pFramesOut,(void *)0x0,frameCount);
      return;
    }
    local_1040 = &(pDevice->playback).converter;
    local_1048 = &(pDevice->playback).converter.resampler;
    local_1060 = 0;
    do {
      uVar3 = outputFrameCount - local_1060;
      if (outputFrameCount < local_1060 || uVar3 == 0) {
        return;
      }
      uVar2 = 0x1000 / (ulong)((&DAT_001157a0)[(pDevice->playback).format] *
                              (pDevice->playback).channels);
      uVar4 = uVar3;
      if (uVar2 <= uVar3) {
        uVar4 = uVar2;
      }
      uVar2 = outputFrameCount;
      if (((pDevice->playback).converter.field_0x2768 & 8) != 0) {
        uVar2 = ma_resampler_get_required_input_frame_count(local_1048,outputFrameCount);
      }
      if (uVar2 <= uVar4) {
        uVar4 = uVar2;
      }
      if (uVar4 != 0) {
        ma_device__on_data(pDevice,local_1038,(void *)0x0,(ma_uint32)uVar4);
      }
      local_1058 = uVar3;
      local_1050 = uVar4;
      mVar1 = ma_data_converter_process_pcm_frames
                        (local_1040,local_1038,&local_1050,pFramesOut,&local_1058);
      if (mVar1 == 0) {
        local_1060 = local_1060 + local_1058;
        pFramesOut = (void *)((long)pFramesOut +
                             ((&DAT_001157a0)[(pDevice->playback).internalFormat] *
                             (pDevice->playback).internalChannels) * local_1058);
      }
    } while (mVar1 == 0 && (local_1050 != 0 || local_1058 != 0));
    return;
  }
  __assert_fail("pFramesOut != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x22f0,"void ma_device__read_frames_from_client(ma_device *, ma_uint32, void *)");
}

Assistant:

static void ma_device__read_frames_from_client(ma_device* pDevice, ma_uint32 frameCount, void* pFramesOut)
{
    MA_ASSERT(pDevice != NULL);
    MA_ASSERT(frameCount > 0);
    MA_ASSERT(pFramesOut != NULL);

    if (pDevice->playback.converter.isPassthrough) {
        ma_device__on_data(pDevice, pFramesOut, NULL, frameCount);
    } else {
        ma_result result;
        ma_uint64 totalFramesReadOut;
        ma_uint64 totalFramesReadIn;
        void* pRunningFramesOut;

        totalFramesReadOut = 0;
        totalFramesReadIn  = 0;
        pRunningFramesOut  = pFramesOut;

        while (totalFramesReadOut < frameCount) {
            ma_uint8 pIntermediaryBuffer[MA_DATA_CONVERTER_STACK_BUFFER_SIZE];  /* In client format. */
            ma_uint64 intermediaryBufferCap = sizeof(pIntermediaryBuffer) / ma_get_bytes_per_frame(pDevice->playback.format, pDevice->playback.channels);
            ma_uint64 framesToReadThisIterationIn;
            ma_uint64 framesReadThisIterationIn;
            ma_uint64 framesToReadThisIterationOut;
            ma_uint64 framesReadThisIterationOut;
            ma_uint64 requiredInputFrameCount;

            framesToReadThisIterationOut = (frameCount - totalFramesReadOut);
            framesToReadThisIterationIn = framesToReadThisIterationOut;
            if (framesToReadThisIterationIn > intermediaryBufferCap) {
                framesToReadThisIterationIn = intermediaryBufferCap;
            }

            requiredInputFrameCount = ma_data_converter_get_required_input_frame_count(&pDevice->playback.converter, frameCount);
            if (framesToReadThisIterationIn > requiredInputFrameCount) {
                framesToReadThisIterationIn = requiredInputFrameCount;
            }

            if (framesToReadThisIterationIn > 0) {
                ma_device__on_data(pDevice, pIntermediaryBuffer, NULL, (ma_uint32)framesToReadThisIterationIn);
                totalFramesReadIn += framesToReadThisIterationIn;
            }

            /*
            At this point we have our decoded data in input format and now we need to convert to output format. Note that even if we didn't read any
            input frames, we still want to try processing frames because there may some output frames generated from cached input data.
            */
            framesReadThisIterationIn  = framesToReadThisIterationIn;
            framesReadThisIterationOut = framesToReadThisIterationOut;
            result = ma_data_converter_process_pcm_frames(&pDevice->playback.converter, pIntermediaryBuffer, &framesReadThisIterationIn, pRunningFramesOut, &framesReadThisIterationOut);
            if (result != MA_SUCCESS) {
                break;
            }

            totalFramesReadOut += framesReadThisIterationOut;
            pRunningFramesOut   = ma_offset_ptr(pRunningFramesOut, framesReadThisIterationOut * ma_get_bytes_per_frame(pDevice->playback.internalFormat, pDevice->playback.internalChannels));

            if (framesReadThisIterationIn == 0 && framesReadThisIterationOut == 0) {
                break;  /* We're done. */
            }
        }
    }
}